

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void ossdsp_str(osgen_win_t *win,int y,int x,int color,char *str,size_t len,int *delta_yscroll)

{
  int iVar1;
  ulong uVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  uchar oldc;
  size_t cur;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  ulong local_28;
  long local_20;
  int local_10;
  int local_c;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_10 = in_EDX;
  iVar1 = in_ESI;
  if (cur != 0) {
    *(undefined4 *)cur = 0;
    iVar1 = in_ESI;
  }
  while (local_c = iVar1, local_28 != 0) {
    uVar2 = ((long)*(int *)(in_RDI + 0x2c) + *(long *)(in_RDI + 0x38)) - (long)local_10;
    if (local_28 < uVar2) {
      uVar2 = local_28;
    }
    in_stack_ffffffffffffffcc =
         CONCAT13(*(undefined1 *)(local_20 + uVar2),(int3)in_stack_ffffffffffffffcc);
    *(undefined1 *)(local_20 + uVar2) = 0;
    ossdsp((int)(uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffcc,(char *)0x22466f);
    *(char *)(local_20 + uVar2) = (char)((uint)in_stack_ffffffffffffffcc >> 0x18);
    local_20 = uVar2 + local_20;
    local_28 = local_28 - uVar2;
    local_10 = local_10 + (int)uVar2;
    iVar1 = local_c;
    if (*(int *)(in_RDI + 0x2c) + (int)*(undefined8 *)(in_RDI + 0x38) <= local_10) {
      local_10 = *(int *)(in_RDI + 0x2c);
      iVar1 = local_c + 1;
      if ((*(int *)(in_RDI + 0x30) + (int)*(undefined8 *)(in_RDI + 0x40) <= iVar1) && (cur != 0)) {
        ossscr((int)(uVar2 >> 0x20),(int)uVar2,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,0
              );
        *(int *)(in_RDI + 0x5c) = *(int *)(in_RDI + 0x5c) + 1;
        *(int *)cur = *(int *)cur + 1;
        iVar1 = local_c;
      }
    }
  }
  return;
}

Assistant:

static void ossdsp_str(osgen_win_t *win, int y, int x, int color,
                       char *str, size_t len, int *delta_yscroll)
{
    /* presume we won't scroll */
    if (delta_yscroll != 0)
        *delta_yscroll = 0;

    /* keep going until we exhaust the string */
    while (len != 0)
    {
        size_t cur;
        unsigned char oldc;

        /* display as much as will fit on the current line before wrapping */
        cur = win->winx + win->wid - x;
        if (cur > len)
            cur = len;

        /* null-terminate the chunk, but save the original character */
        oldc = str[cur];
        str[cur] = '\0';

        /* display this chunk */
        ossdsp(y, x, color, (char *)str);

        /* restore the character where we put our null */
        str[cur] = oldc;

        /* move our string counters past this chunk */
        str += cur;
        len -= cur;

        /* advance the x position */
        x += cur;

        /* if we've reached the right edge of the window, wrap the line */
        if (x >= win->winx + (int)win->wid)
        {
            /* wrap to the left edge of the window */
            x = win->winx;

            /* advance to the next line */
            ++y;

            /* 
             *   if this puts us past the bottom of the window, and we're
             *   allowed to scroll the window, do so
             */
            if (y >= win->winy + (int)win->ht && delta_yscroll != 0)
            {
                /* scroll by one line */
                ossscr(win->winy, win->winx,
                       win->winy + win->ht - 1, win->winx + win->wid - 1,
                       win->oss_fillcolor);

                /* adjust the scroll position of the window */
                win->scrolly++;

                /* count the scrolling */
                ++(*delta_yscroll);

                /* move back a line */
                --y;
            }
        }
    }
}